

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O3

void uavs3d_funs_init_pixel_opt_c(void)

{
  uavs3d_funs_handle.padding_rows_luma = padding_rows_luma;
  uavs3d_funs_handle.padding_rows_chroma = padding_rows_chroma;
  uavs3d_funs_handle.conv_fmt_8bit = conv_fmt_8bit_c;
  uavs3d_funs_handle.conv_fmt_16bit = conv_fmt_16bit_c;
  uavs3d_funs_handle.conv_fmt_16to8bit = conv_fmt_16to8bit_c;
  uavs3d_funs_handle.reset_map_scu = reset_map_scu;
  return;
}

Assistant:

void uavs3d_funs_init_pixel_opt_c()
{
    uavs3d_funs_handle.padding_rows_luma = padding_rows_luma;
    uavs3d_funs_handle.padding_rows_chroma = padding_rows_chroma;
    uavs3d_funs_handle.conv_fmt_8bit = conv_fmt_8bit_c;
    uavs3d_funs_handle.conv_fmt_16bit = conv_fmt_16bit_c;
    uavs3d_funs_handle.conv_fmt_16to8bit = conv_fmt_16to8bit_c;
    uavs3d_funs_handle.reset_map_scu = reset_map_scu;
}